

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LzmaDecompress.c
# Opt level: O3

USTATUS LzmaDecompress(void *Source,UINT32 SourceSize,void *Destination)

{
  SRes SVar1;
  ulong uVar2;
  ELzmaStatus Status;
  SizeT EncodedDataSize;
  SizeT DecodedBufSize;
  
  uVar2 = 0xd;
  DecodedBufSize = 0;
  do {
    DecodedBufSize = (ulong)*(byte *)((long)Source + (uVar2 - 1)) | DecodedBufSize << 8;
    uVar2 = uVar2 - 1;
  } while (5 < uVar2);
  EncodedDataSize = (SizeT)(SourceSize - 0xd);
  SVar1 = LzmaDecode((Byte *)Destination,&DecodedBufSize,(Byte *)((long)Source + 0xd),
                     &EncodedDataSize,(Byte *)Source,5,LZMA_FINISH_END,&Status,&SzAllocForLzma);
  return (ulong)(SVar1 != 0);
}

Assistant:

USTATUS
EFIAPI
LzmaDecompress (
    CONST VOID  *Source,
    UINT32      SourceSize,
    VOID        *Destination
    )
{
    SRes              LzmaResult;
    ELzmaStatus       Status;
    SizeT             DecodedBufSize;
    SizeT             EncodedDataSize;

    DecodedBufSize = (SizeT)GetDecodedSizeOfBuf((UINT8*)Source);
    EncodedDataSize = (SizeT)(SourceSize - LZMA_HEADER_SIZE);

    LzmaResult = LzmaDecode(
        (Byte*)Destination,
        &DecodedBufSize,
        (Byte*)((UINT8*)Source + LZMA_HEADER_SIZE),
        &EncodedDataSize,
        (CONST Byte*) Source,
        LZMA_PROPS_SIZE,
        LZMA_FINISH_END,
        &Status,
        &SzAllocForLzma
        );

    if (LzmaResult == SZ_OK) {
        return U_SUCCESS;
    }
    else {
        return U_INVALID_PARAMETER;
    }
}